

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O2

Path * __thiscall kj::PathPtr::append(Path *__return_storage_ptr__,PathPtr *this,Path *suffix)

{
  String *pSVar1;
  String *p_1;
  String *pSVar2;
  long lVar3;
  Array<kj::String> *__range1;
  String *p;
  size_t count;
  ArrayBuilder<kj::String> newParts;
  Array<char> local_68;
  Array<kj::String> local_48;
  
  count = (suffix->parts).size_ + (this->parts).size_;
  newParts.ptr = kj::_::HeapArrayDisposer::allocateUninitialized<kj::String>(count);
  newParts.endPtr = newParts.ptr + count;
  newParts.disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  pSVar2 = (this->parts).ptr;
  newParts.pos = newParts.ptr;
  for (lVar3 = (this->parts).size_ * 0x18; pSVar1 = newParts.ptr, lVar3 != 0; lVar3 = lVar3 + -0x18)
  {
    heapString((String *)&local_68,pSVar2);
    ((newParts.pos)->content).ptr = local_68.ptr;
    ((newParts.pos)->content).size_ = local_68.size_;
    ((newParts.pos)->content).disposer = local_68.disposer;
    local_68.ptr = (char *)0x0;
    local_68.size_ = 0;
    newParts.pos = newParts.pos + 1;
    Array<char>::~Array(&local_68);
    pSVar2 = pSVar2 + 1;
  }
  pSVar2 = (suffix->parts).ptr;
  for (lVar3 = (suffix->parts).size_ * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    ((newParts.pos)->content).ptr = (pSVar2->content).ptr;
    ((newParts.pos)->content).size_ = (pSVar2->content).size_;
    ((newParts.pos)->content).disposer = (pSVar2->content).disposer;
    (pSVar2->content).ptr = (char *)0x0;
    (pSVar2->content).size_ = 0;
    newParts.pos = newParts.pos + 1;
    pSVar2 = pSVar2 + 1;
  }
  lVar3 = (long)newParts.pos - (long)newParts.ptr;
  local_48.disposer = newParts.disposer;
  newParts.ptr = (String *)0x0;
  newParts.pos = (RemoveConst<kj::String> *)0x0;
  newParts.endPtr = (String *)0x0;
  (__return_storage_ptr__->parts).ptr = pSVar1;
  (__return_storage_ptr__->parts).size_ = lVar3 / 0x18;
  (__return_storage_ptr__->parts).disposer = newParts.disposer;
  local_48.ptr = (String *)0x0;
  local_48.size_ = 0;
  Array<kj::String>::~Array(&local_48);
  ArrayBuilder<kj::String>::dispose(&newParts);
  return __return_storage_ptr__;
}

Assistant:

Path PathPtr::append(Path&& suffix) const {
  auto newParts = kj::heapArrayBuilder<String>(parts.size() + suffix.parts.size());
  for (auto& p: parts) newParts.add(heapString(p));
  for (auto& p: suffix.parts) newParts.add(kj::mv(p));
  return Path(newParts.finish(), Path::ALREADY_CHECKED);
}